

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

void Abc_TtMakePosUnate(word *t,int nVars)

{
  word wVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  word *pLimit;
  word *pwVar9;
  word *pwVar10;
  int iVar11;
  uint uVar12;
  word *tLimit;
  ulong uVar13;
  ulong uVar14;
  
  if (0 < nVars) {
    iVar7 = nVars + -6;
    uVar12 = 1 << ((byte)iVar7 & 0x1f);
    uVar2 = uVar12;
    if (nVars < 7) {
      uVar2 = 1;
    }
    uVar3 = uVar12;
    if ((int)uVar12 < 2) {
      uVar3 = 1;
    }
    uVar8 = 0;
    do {
      bVar6 = (byte)uVar8;
      if (nVars < 7) {
        if ((~(*t << ((byte)(1 << (bVar6 & 0x1f)) & 0x3f)) & s_Truths6[uVar8] & *t) == 0)
        goto LAB_0081adf8;
LAB_0081ad68:
        if (nVars < 7) {
          if ((~(*t >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f)) & s_Truths6Neg[uVar8] & *t) != 0) {
LAB_0081b031:
            __assert_fail("Abc_TtPosVar(t, nVars, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0x8ed,"void Abc_TtMakePosUnate(word *, int)");
          }
        }
        else if (uVar8 < 6) {
          if (iVar7 != 0x1f) {
            uVar13 = 0;
            do {
              if ((~(t[uVar13] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f)) & s_Truths6Neg[uVar8] &
                  t[uVar13]) != 0) goto LAB_0081b031;
              uVar13 = uVar13 + 1;
            } while (uVar3 != uVar13);
          }
        }
        else if (iVar7 != 0x1f) {
          bVar6 = (byte)(uVar8 - 6);
          uVar4 = 1 << (bVar6 & 0x1f);
          iVar11 = 2 << (bVar6 & 0x1f);
          uVar13 = 1;
          if (1 < (int)uVar4) {
            uVar13 = (ulong)uVar4;
          }
          pwVar10 = t + (int)uVar4;
          pwVar9 = t;
          do {
            if (uVar8 - 6 != 0x1f) {
              uVar14 = 0;
              do {
                if ((pwVar9[uVar14] & ~pwVar10[uVar14]) != 0) goto LAB_0081b031;
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            pwVar9 = pwVar9 + iVar11;
            pwVar10 = pwVar10 + iVar11;
          } while (pwVar9 < t + (int)uVar12);
        }
      }
      else {
        if (uVar8 < 6) {
          if (iVar7 != 0x1f) {
            uVar13 = 0;
            do {
              if ((~(t[uVar13] << ((byte)(1 << (bVar6 & 0x1f)) & 0x3f)) & s_Truths6[uVar8] &
                  t[uVar13]) != 0) goto LAB_0081ad68;
              uVar13 = uVar13 + 1;
            } while (uVar3 != uVar13);
          }
        }
        else if (iVar7 != 0x1f) {
          bVar5 = (byte)(uVar8 - 6);
          uVar4 = 1 << (bVar5 & 0x1f);
          iVar11 = 2 << (bVar5 & 0x1f);
          uVar13 = 1;
          if (1 < (int)uVar4) {
            uVar13 = (ulong)uVar4;
          }
          pwVar10 = t + (int)uVar4;
          pwVar9 = t;
          do {
            if (uVar8 - 6 != 0x1f) {
              uVar14 = 0;
              do {
                if ((pwVar10[uVar14] & ~pwVar9[uVar14]) != 0) goto LAB_0081ad68;
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            pwVar9 = pwVar9 + iVar11;
            pwVar10 = pwVar10 + iVar11;
          } while (pwVar9 < t + (int)uVar12);
        }
LAB_0081adf8:
        if (uVar2 == 1) {
          bVar6 = (byte)(1 << (bVar6 & 0x1f));
          *t = (s_Truths6[uVar8] & *t) >> (bVar6 & 0x3f) | *t << (bVar6 & 0x3f) & s_Truths6[uVar8];
        }
        else if (uVar8 < 6) {
          if (0 < (int)uVar2) {
            uVar13 = s_Truths6[uVar8];
            uVar14 = 0;
            do {
              bVar5 = (byte)(1 << (bVar6 & 0x1f));
              t[uVar14] = (t[uVar14] & uVar13) >> (bVar5 & 0x3f) |
                          t[uVar14] << (bVar5 & 0x3f) & uVar13;
              uVar14 = uVar14 + 1;
            } while (uVar2 != uVar14);
          }
        }
        else if (0 < (int)uVar2) {
          bVar6 = (byte)(uVar8 - 6);
          uVar4 = 1 << (bVar6 & 0x1f);
          iVar11 = 2 << (bVar6 & 0x1f);
          uVar13 = 1;
          if (1 < (int)uVar4) {
            uVar13 = (ulong)uVar4;
          }
          pwVar10 = t + (int)uVar4;
          pwVar9 = t;
          do {
            if (uVar8 - 6 != 0x1f) {
              uVar14 = 0;
              do {
                wVar1 = pwVar9[uVar14];
                pwVar9[uVar14] = pwVar10[uVar14];
                pwVar10[uVar14] = wVar1;
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            pwVar9 = pwVar9 + iVar11;
            pwVar10 = pwVar10 + iVar11;
          } while (pwVar9 < t + (int)uVar2);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nVars);
  }
  return;
}

Assistant:

static inline void Abc_TtMakePosUnate( word * t, int nVars )
{
    int i, nWords = Abc_TtWordNum(nVars);
    for ( i = 0; i < nVars; i++ )
        if ( Abc_TtNegVar(t, nVars, i) )
            Abc_TtFlip( t, nWords, i );
        else assert( Abc_TtPosVar(t, nVars, i) );
}